

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_defs.hpp
# Opt level: O0

bool __thiscall
iutest::floating_point<long_double>::AlmostNear
          (floating_point<long_double> *this,_Myt *rhs,longdouble max_abs_error)

{
  bool bVar1;
  undefined1 local_58 [8];
  _Myt abs_error;
  _Myt abs;
  longdouble max_abs_error_local;
  _Myt *rhs_local;
  floating_point<long_double> *this_local;
  
  bVar1 = is_nan(this);
  if ((bVar1) || (bVar1 = is_nan(rhs), bVar1)) {
    return false;
  }
  if ((*(longdouble *)&this->m_v == *(longdouble *)&rhs->m_v) &&
     (!NAN(*(longdouble *)&this->m_v) && !NAN(*(longdouble *)&rhs->m_v))) {
    return true;
  }
  Abs((_Myt *)((long)&abs_error.m_v + 8),this,rhs);
  if (stack0xffffffffffffffb8 <= max_abs_error) {
    return true;
  }
  floating_point((floating_point<long_double> *)local_58,max_abs_error);
  bVar1 = AlmostEquals((floating_point<long_double> *)((long)&abs_error.m_v + 8),(_Myt *)local_58);
  if (!bVar1) {
    return false;
  }
  return true;
}

Assistant:

bool    AlmostNear(const _Myt& rhs, RawType max_abs_error) const
    {
        if( is_nan() || rhs.is_nan() )
        {
            return false;
        }
IUTEST_PRAGMA_WARN_PUSH()
IUTEST_PRAGMA_WARN_DISABLE_FLOAT_EQUAL()
        if( m_v.fv == rhs.m_v.fv )
        {
            return true;
        }
IUTEST_PRAGMA_WARN_POP()
        _Myt abs = Abs(rhs);
        if( abs.m_v.fv <= max_abs_error )
        {
            return true;
        }
        _Myt abs_error = _Myt(max_abs_error);
        if( abs.AlmostEquals(abs_error) ) {
            return true;
        }
        return false;
    }